

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O2

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestIterationStart
          (PrettyUnitTestResultPrinter *this,UnitTest *unit_test,int iteration)

{
  bool bVar1;
  Int32 IVar2;
  uint uVar3;
  char *pcVar4;
  int test_count;
  int test_case_count;
  string local_58;
  string local_38;
  
  if (FLAGS_gtest_repeat != 1) {
    printf("\nRepeating all tests (iteration %d) . . .\n\n",(ulong)(iteration + 1));
  }
  pcVar4 = FLAGS_gtest_filter_abi_cxx11_;
  bVar1 = String::CStringEquals(FLAGS_gtest_filter_abi_cxx11_,"*");
  if (!bVar1) {
    ColoredPrintf(COLOR_YELLOW,"Note: %s filter = %s\n","Google Test",pcVar4);
  }
  bVar1 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",false);
  if (bVar1) {
    IVar2 = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
    pcVar4 = getenv("GTEST_TOTAL_SHARDS");
    ColoredPrintf(COLOR_YELLOW,"Note: This is test shard %d of %s.\n",(ulong)(IVar2 + 1),pcVar4);
  }
  if (FLAGS_gtest_shuffle == '\x01') {
    ColoredPrintf(COLOR_YELLOW,"Note: Randomizing tests\' orders with a seed of %d .\n",
                  (ulong)(uint)unit_test->impl_->random_seed_);
  }
  ColoredPrintf(COLOR_GREEN,"[==========] ");
  uVar3 = UnitTest::test_to_run_count(unit_test);
  FormatTestCount_abi_cxx11_(&local_58,(testing *)(ulong)uVar3,test_count);
  uVar3 = UnitTest::test_case_to_run_count(unit_test);
  FormatTestCaseCount_abi_cxx11_(&local_38,(testing *)(ulong)uVar3,test_case_count);
  printf("Running %s from %s.\n",local_58._M_dataplus._M_p,local_38._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  fflush(_stdout);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestIterationStart(
    const UnitTest& unit_test, int iteration) {
  if (GTEST_FLAG(repeat) != 1)
    printf("\nRepeating all tests (iteration %d) . . .\n\n", iteration + 1);

  const char* const filter = GTEST_FLAG(filter).c_str();

  // Prints the filter if it's not *.  This reminds the user that some
  // tests may be skipped.
  if (!String::CStringEquals(filter, kUniversalFilter)) {
    ColoredPrintf(COLOR_YELLOW,
                  "Note: %s filter = %s\n", GTEST_NAME_, filter);
  }

  if (internal::ShouldShard(kTestTotalShards, kTestShardIndex, false)) {
    const Int32 shard_index = Int32FromEnvOrDie(kTestShardIndex, -1);
    ColoredPrintf(COLOR_YELLOW,
                  "Note: This is test shard %d of %s.\n",
                  static_cast<int>(shard_index) + 1,
                  internal::posix::GetEnv(kTestTotalShards));
  }

  if (GTEST_FLAG(shuffle)) {
    ColoredPrintf(COLOR_YELLOW,
                  "Note: Randomizing tests' orders with a seed of %d .\n",
                  unit_test.random_seed());
  }

  ColoredPrintf(COLOR_GREEN,  "[==========] ");
  printf("Running %s from %s.\n",
         FormatTestCount(unit_test.test_to_run_count()).c_str(),
         FormatTestCaseCount(unit_test.test_case_to_run_count()).c_str());
  fflush(stdout);
}